

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  undefined1 *this_00;
  undefined8 uVar1;
  double dVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  int *idx;
  pointer pBVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  Item *pIVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar14;
  BreakpointSource BVar15;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  undefined8 uVar17;
  undefined1 uVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  DataKey DVar23;
  undefined8 uVar24;
  int iVar22;
  undefined8 uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  undefined4 *puVar32;
  cpp_dec_float<200U,_int,_void> *pcVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar35;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar36;
  cpp_dec_float<200U,_int,_void> *pcVar37;
  uint *puVar38;
  uint *puVar39;
  pointer pBVar40;
  pointer pBVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar43;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar44;
  pointer pnVar45;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar46;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar47;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar48;
  char cVar49;
  pointer pnVar50;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar51;
  bool bVar52;
  byte bVar53;
  ulong uVar54;
  pointer pnVar55;
  pointer pnVar56;
  BreakpointSource BVar57;
  uint local_e0c;
  cpp_dec_float<200U,_int,_void> *local_e08;
  int nBp;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_df8;
  uint local_df0;
  fpclass_type local_dec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  SPxId enterId;
  int minIdx;
  pointer local_d48;
  pointer local_d40;
  pointer local_d38;
  pointer local_d30;
  pointer local_d28;
  pointer local_d20;
  pointer local_d18;
  pointer local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  BreakpointCompare compare;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [13];
  undefined3 uStack_afb;
  int iStack_af8;
  bool bStack_af4;
  undefined8 local_af0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [13];
  undefined3 uStack_9fb;
  int iStack_9f8;
  bool bStack_9f4;
  undefined8 local_9f0;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [13];
  undefined3 uStack_97b;
  int iStack_978;
  bool bStack_974;
  undefined8 local_970;
  cpp_dec_float<200U,_int,_void> local_968;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_800;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_780;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_700;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_680;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_600;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_580;
  uint local_500 [28];
  uint local_490 [28];
  uint local_420 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  undefined8 uVar25;
  undefined8 uVar26;
  
  bVar53 = 0;
  iVar20 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->leaveCount;
  if ((iVar20 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar20 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x234,1);
  }
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x231 != '\x01' || polish) ||
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep == ROW)) goto LAB_005d13ef;
  this_00 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).field_0x234;
  if (*(int *)&this->field_0x2ac != 2) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)this_00,&lowstab.m_backend);
    if (iVar20 < 1) goto LAB_005d13ef;
  }
  pSVar5 = (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver;
  pUVar43 = pSVar5->theCoPvec;
  pUVar6 = pSVar5->thePvec;
  local_d20 = (pUVar6->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d38 = (pUVar6->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar6->thedelta).super_IdxSet.idx;
  iVar20 = (pUVar6->thedelta).super_IdxSet.num;
  local_d48 = (pSVar5->theLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d28 = (pSVar5->theUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d10 = (pUVar43->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d30 = (pUVar43->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_e08 = (cpp_dec_float<200U,_int,_void> *)(pUVar43->thedelta).super_IdxSet.idx;
  local_df8 = (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_df8._4_4_,(pUVar43->thedelta).super_IdxSet.num);
  local_d40 = (pSVar5->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d18 = (pSVar5->theCoUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_818 = (undefined1  [16])0x0;
  local_828 = (undefined1  [16])0x0;
  local_838 = (undefined1  [16])0x0;
  local_848 = (undefined1  [16])0x0;
  local_858 = (undefined1  [16])0x0;
  local_868 = (undefined1  [16])0x0;
  local_878 = (undefined1  [16])0x0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_af0._0_4_ = cpp_dec_float_finite;
  local_af0._4_4_ = 0x1c;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = (undefined1  [16])0x0;
  local_b48 = (undefined1  [16])0x0;
  local_b38 = (undefined1  [16])0x0;
  local_b28 = (undefined1  [16])0x0;
  local_b18 = (undefined1  [16])0x0;
  local_b08 = SUB1613((undefined1  [16])0x0,0);
  uStack_afb = 0;
  iStack_af8 = 0;
  bStack_af4 = false;
  local_9f0._0_4_ = cpp_dec_float_finite;
  local_9f0._4_4_ = 0x1c;
  local_a68 = (undefined1  [16])0x0;
  local_a58 = (undefined1  [16])0x0;
  local_a48 = (undefined1  [16])0x0;
  local_a38 = (undefined1  [16])0x0;
  local_a28 = (undefined1  [16])0x0;
  local_a18 = (undefined1  [16])0x0;
  local_a08 = SUB1613((undefined1  [16])0x0,0);
  uStack_9fb = 0;
  iStack_9f8 = 0;
  bStack_9f4 = false;
  local_888 = (undefined1  [16])0x0;
  local_898 = (undefined1  [16])0x0;
  local_8a8 = (undefined1  [16])0x0;
  local_8b8 = (undefined1  [16])0x0;
  local_8c8 = (undefined1  [16])0x0;
  local_8d8 = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_970._0_4_ = cpp_dec_float_finite;
  local_970._4_4_ = 0x1c;
  local_9e8 = (undefined1  [16])0x0;
  local_9d8 = (undefined1  [16])0x0;
  local_9c8 = (undefined1  [16])0x0;
  local_9b8 = (undefined1  [16])0x0;
  local_9a8 = (undefined1  [16])0x0;
  local_998 = (undefined1  [16])0x0;
  local_988 = SUB1613((undefined1  [16])0x0,0);
  uStack_97b = 0;
  iStack_978 = 0;
  bStack_974 = false;
  pnVar36 = val;
  pcVar37 = &local_968;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
  }
  local_968.exp = (val->m_backend).exp;
  local_968.neg = (val->m_backend).neg;
  local_968.fpclass = (val->m_backend).fpclass;
  local_968.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b68,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_968.fpclass == cpp_dec_float_NaN) {
LAB_005d1406:
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar20,local_d38,local_d20,local_d28,local_d48,PVEC)
    ;
    collectBreakpointsMin
              (this,&nBp,&minIdx,(int *)local_e08,(int)local_df8,local_d30,local_d10,local_d18,
               local_d40,COPVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_968,&lowstab.m_backend);
    if (iVar21 < 1) goto LAB_005d1406;
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar20,local_d38,local_d20,local_d28,local_d48,PVEC)
    ;
    collectBreakpointsMax
              (this,&nBp,&minIdx,(int *)local_e08,(int)local_df8,local_d30,local_d10,local_d18,
               local_d40,COPVEC);
  }
  if (nBp == 0) {
    pcVar37 = &local_968;
    pnVar36 = val;
    for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
      (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
      pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
    }
    (val->m_backend).exp = local_968.exp;
    (val->m_backend).neg = local_968.neg;
    (val->m_backend).fpclass = local_968.fpclass;
    (val->m_backend).prec_elem = local_968.prec_elem;
    uVar27._0_4_ = enterId.super_DataKey.info;
    uVar27._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar27;
  }
  lVar29 = (long)minIdx;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar40 = pBVar7 + lVar29;
  puVar32 = (undefined4 *)local_878;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar32 = *(undefined4 *)&pBVar40->val;
    pBVar40 = (pointer)((long)pBVar40 + ((ulong)bVar53 * -2 + 1) * 4);
    puVar32 = puVar32 + (ulong)bVar53 * -2 + 1;
  }
  iVar20 = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x70);
  bVar52 = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x74);
  iVar21 = pBVar7[lVar29].idx;
  BVar57 = pBVar7[lVar29].src;
  pBVar40 = pBVar7;
  pBVar41 = pBVar7 + lVar29;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *(undefined4 *)&pBVar41->val = *(undefined4 *)&(pBVar40->val).m_backend;
    pBVar40 = (pointer)((long)pBVar40 + ((ulong)bVar53 * -2 + 1) * 4);
    pBVar41 = (pointer)((long)pBVar41 + ((ulong)bVar53 * -2 + 1) * 4);
  }
  *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x70) =
       *(int *)((long)&(pBVar7->val).m_backend + 0x70);
  *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x74) =
       *(bool *)((long)&(pBVar7->val).m_backend + 0x74);
  uVar27 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x78);
  BVar15 = pBVar7->src;
  pBVar7[lVar29].idx = pBVar7->idx;
  pBVar7[lVar29].src = BVar15;
  uVar8 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x78);
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x78) = uVar27;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar32 = (undefined4 *)local_878;
  pBVar40 = pBVar7;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    *(undefined4 *)&(pBVar40->val).m_backend = *puVar32;
    puVar32 = puVar32 + (ulong)bVar53 * -2 + 1;
    pBVar40 = (pointer)((long)pBVar40 + ((ulong)bVar53 * -2 + 1) * 4);
  }
  *(int *)((long)&(pBVar7->val).m_backend + 0x70) = iVar20;
  *(bool *)((long)&(pBVar7->val).m_backend + 0x74) = bVar52;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x78) = uVar8;
  pBVar7->idx = iVar21;
  pBVar7->src = BVar57;
  pnVar50 = (((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver)->theCoTest).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + leaveIdx;
  iVar20 = *(int *)&(pnVar50->m_backend).data;
  puVar39 = (uint *)((long)&(pnVar50->m_backend).data + 4);
  pnVar36 = &lowstab;
  for (lVar29 = 0x1b; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pnVar36->m_backend).data._M_elems[0] = *puVar39;
    puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
  }
  iVar21 = (pnVar50->m_backend).exp;
  cVar49 = (pnVar50->m_backend).neg;
  uVar8._0_4_ = (pnVar50->m_backend).fpclass;
  uVar8._4_4_ = (pnVar50->m_backend).prec_elem;
  if ((bool)cVar49 == true) {
    cVar49 = (fpclass_type)uVar8 == cpp_dec_float_finite && iVar20 == 0;
  }
  local_a68._0_4_ = iVar20;
  pnVar36 = &lowstab;
  puVar39 = (uint *)(local_a68 + 4);
  for (lVar29 = 0x1b; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar39 = (pnVar36->m_backend).data._M_elems[0];
    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
    puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
  }
  iStack_9f8 = iVar21;
  bStack_9f4 = (bool)cVar49;
  local_9f0 = uVar8;
  if ((fpclass_type)uVar8 != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_a68,&lowstab.m_backend);
    if (iVar20 == 0) {
      pSVar5 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      uVar28 = (pSVar5->instableLeaveVal).m_backend.data._M_elems[0];
      iVar20 = (pSVar5->instableLeaveVal).m_backend.exp;
      cVar49 = (pSVar5->instableLeaveVal).m_backend.neg;
      uVar1._0_4_ = (pSVar5->instableLeaveVal).m_backend.fpclass;
      uVar1._4_4_ = (pSVar5->instableLeaveVal).m_backend.prec_elem;
      if ((bool)cVar49 == true) {
        cVar49 = (fpclass_type)uVar1 == cpp_dec_float_finite && uVar28 == 0;
      }
      local_a68._0_4_ = uVar28;
      puVar39 = (pSVar5->instableLeaveVal).m_backend.data._M_elems + 1;
      puVar38 = (uint *)(local_a68 + 4);
      for (lVar29 = 0x1b; iStack_9f8 = iVar20, bStack_9f4 = (bool)cVar49, local_9f0 = uVar1,
          lVar29 != 0; lVar29 = lVar29 + -1) {
        *puVar38 = *puVar39;
        puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        puVar38 = puVar38 + (ulong)bVar53 * -2 + 1;
      }
    }
  }
  compare.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0c = 0;
  iVar20 = 0;
  local_df8 = this;
  if ((0 < nBp) && (iVar20 = 0, (fpclass_type)local_9f0 != cpp_dec_float_NaN)) {
    iVar20 = 0;
    while( true ) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&lowstab.m_backend,0,(type *)0x0);
      iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_a68,&lowstab.m_backend);
      pSVar16 = local_df8;
      if (iVar21 < 1) break;
      if (iVar20 < (int)local_e0c) {
        iVar20 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                           ((local_df8->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&compare,iVar20 + 1,nBp,4,0,0,
                            true);
      }
      lVar29 = (long)(int)local_e0c;
      pBVar7 = (pSVar16->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = pBVar7[lVar29].idx;
      pSVar5 = (pSVar16->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      if (pBVar7[lVar29].src == PVEC) {
        if (0 < pSVar5->theRep *
                ((pSVar5->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat)->data[iVar21]) {
          pBVar7[lVar29].idx = -1;
          pUVar43 = pSVar5->thePvec;
          goto LAB_005d1795;
        }
        pnVar36 = local_d38 + iVar21;
        puVar39 = local_420;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          *puVar39 = (pnVar36->m_backend).data._M_elems[0];
          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
          puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        }
        iVar22 = local_d38[iVar21].m_backend.exp;
        bVar52 = local_d38[iVar21].m_backend.neg;
        uVar10._0_4_ = local_d38[iVar21].m_backend.fpclass;
        uVar10._4_4_ = local_d38[iVar21].m_backend.prec_elem;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x1c;
        lowstab.m_backend.neg = false;
        lowstab.m_backend.exp = 0;
        puVar39 = local_420;
        pcVar37 = &lowstab.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar37->data)._M_elems[0] = *puVar39;
          puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
        }
        lowstab.m_backend.neg = bVar52;
        if ((bVar52 == true) &&
           ((fpclass_type)uVar10 != cpp_dec_float_finite || lowstab.m_backend.data._M_elems[0] != 0)
           ) {
          lowstab.m_backend.neg = false;
        }
        pcVar37 = &(pSVar5->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        if (&result_1.m_backend != pcVar37) {
          pcVar33 = pcVar37;
          pcVar42 = &result_1.m_backend;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar42->data)._M_elems[0] = (pcVar33->data)._M_elems[0];
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
            pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar53 * -8 + 4);
          }
          result_1.m_backend.exp = pcVar37->exp;
          result_1.m_backend.neg = pcVar37->neg;
          result_1.m_backend.fpclass = pcVar37->fpclass;
          result_1.m_backend.prec_elem = pcVar37->prec_elem;
        }
        lowstab.m_backend.exp = iVar22;
        lowstab.m_backend._120_8_ = uVar10;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_1.m_backend,&lowstab.m_backend);
        pnVar36 = (((local_df8->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar21;
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        if (&result_2 != pnVar36) {
          pnVar34 = pnVar36;
          pnVar46 = &result_2;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pnVar46->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
            pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
          }
          result_2.m_backend.exp = (pnVar36->m_backend).exp;
          result_2.m_backend.neg = (pnVar36->m_backend).neg;
          result_2.m_backend.fpclass = (pnVar36->m_backend).fpclass;
          result_2.m_backend.prec_elem = (pnVar36->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_2.m_backend,&lowstab.m_backend);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        pcVar37 = &result_1.m_backend;
        pcVar33 = &result_3.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
          pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
        }
        result_3.m_backend.exp = result_1.m_backend.exp;
        result_3.m_backend.neg = result_1.m_backend.neg;
        result_3.m_backend.fpclass = result_1.m_backend.fpclass;
        result_3.m_backend.prec_elem = result_1.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_3.m_backend,&result_2.m_backend);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_a68,&result_3.m_backend);
        if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
          goto joined_r0x005d1cad;
        }
      }
      else if (pSVar5->theRep *
               ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.costat)->data[iVar21] < 1) {
        pnVar36 = local_d30 + iVar21;
        puVar39 = local_490;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          *puVar39 = (pnVar36->m_backend).data._M_elems[0];
          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
          puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        }
        iVar22 = local_d30[iVar21].m_backend.exp;
        bVar52 = local_d30[iVar21].m_backend.neg;
        uVar9._0_4_ = local_d30[iVar21].m_backend.fpclass;
        uVar9._4_4_ = local_d30[iVar21].m_backend.prec_elem;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x1c;
        lowstab.m_backend.neg = false;
        lowstab.m_backend.exp = 0;
        puVar39 = local_490;
        pcVar37 = &lowstab.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar37->data)._M_elems[0] = *puVar39;
          puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
        }
        lowstab.m_backend.neg = bVar52;
        if ((bVar52 == true) &&
           ((fpclass_type)uVar9 != cpp_dec_float_finite || lowstab.m_backend.data._M_elems[0] != 0))
        {
          lowstab.m_backend.neg = false;
        }
        pcVar37 = &(pSVar5->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        if (&result_1.m_backend != pcVar37) {
          pcVar33 = pcVar37;
          pcVar42 = &result_1.m_backend;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar42->data)._M_elems[0] = (pcVar33->data)._M_elems[0];
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
            pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar53 * -8 + 4);
          }
          result_1.m_backend.exp = pcVar37->exp;
          result_1.m_backend.neg = pcVar37->neg;
          result_1.m_backend.fpclass = pcVar37->fpclass;
          result_1.m_backend.prec_elem = pcVar37->prec_elem;
        }
        lowstab.m_backend.exp = iVar22;
        lowstab.m_backend._120_8_ = uVar9;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_1.m_backend,&lowstab.m_backend);
        pnVar36 = (((local_df8->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar21;
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        if (&result_2 != pnVar36) {
          pnVar34 = pnVar36;
          pnVar46 = &result_2;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pnVar46->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
            pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
          }
          result_2.m_backend.exp = (pnVar36->m_backend).exp;
          result_2.m_backend.neg = (pnVar36->m_backend).neg;
          result_2.m_backend.fpclass = (pnVar36->m_backend).fpclass;
          result_2.m_backend.prec_elem = (pnVar36->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_2.m_backend,&lowstab.m_backend);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        pcVar37 = &result_1.m_backend;
        pcVar33 = &result_3.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
          pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
        }
        result_3.m_backend.exp = result_1.m_backend.exp;
        result_3.m_backend.neg = result_1.m_backend.neg;
        result_3.m_backend.fpclass = result_1.m_backend.fpclass;
        result_3.m_backend.prec_elem = result_1.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_3.m_backend,&result_2.m_backend);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_a68,&result_3.m_backend);
        if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
joined_r0x005d1cad:
          if (((fpclass_type)local_af0 != cpp_dec_float_NaN) &&
             (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b68),
             0 < iVar21)) {
            pcVar37 = &lowstab.m_backend;
            puVar39 = (uint *)local_b68;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              *puVar39 = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
            }
            iStack_af8 = lowstab.m_backend.exp;
            bStack_af4 = lowstab.m_backend.neg;
            local_af0._0_4_ = lowstab.m_backend.fpclass;
            local_af0._4_4_ = lowstab.m_backend.prec_elem;
          }
        }
      }
      else {
        pBVar7[lVar29].idx = -1;
        pUVar43 = pSVar5->theCoPvec;
LAB_005d1795:
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearIdx(&pUVar43->thedelta,iVar21);
      }
      local_e0c = local_e0c + 1;
      if ((nBp <= (int)local_e0c) || ((fpclass_type)local_9f0 == cpp_dec_float_NaN)) break;
    }
  }
  this = local_df8;
  local_e0c = local_e0c - 1;
  local_e08 = &(local_df8->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend;
  if (((fpclass_type)local_9f0 != cpp_dec_float_NaN) &&
     ((((local_df8->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .delta.m_backend.fpclass != cpp_dec_float_NaN &&
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_a68,local_e08), 0 < iVar21)) &&
      (nBp + -1 <= (int)local_e0c)))) {
    lowstab.m_backend.fpclass = cpp_dec_float_finite;
    lowstab.m_backend.prec_elem = 0x1c;
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0;
    lowstab.m_backend.data._M_elems[2] = 0;
    lowstab.m_backend.data._M_elems[3] = 0;
    lowstab.m_backend.data._M_elems[4] = 0;
    lowstab.m_backend.data._M_elems[5] = 0;
    lowstab.m_backend.data._M_elems[6] = 0;
    lowstab.m_backend.data._M_elems[7] = 0;
    lowstab.m_backend.data._M_elems[8] = 0;
    lowstab.m_backend.data._M_elems[9] = 0;
    lowstab.m_backend.data._M_elems[10] = 0;
    lowstab.m_backend.data._M_elems[0xb] = 0;
    lowstab.m_backend.data._M_elems[0xc] = 0;
    lowstab.m_backend.data._M_elems[0xd] = 0;
    lowstab.m_backend.data._M_elems[0xe] = 0;
    lowstab.m_backend.data._M_elems[0xf] = 0;
    lowstab.m_backend.data._M_elems[0x10] = 0;
    lowstab.m_backend.data._M_elems[0x11] = 0;
    lowstab.m_backend.data._M_elems[0x12] = 0;
    lowstab.m_backend.data._M_elems[0x13] = 0;
    lowstab.m_backend.data._M_elems[0x14] = 0;
    lowstab.m_backend.data._M_elems[0x15] = 0;
    lowstab.m_backend.data._M_elems[0x16] = 0;
    lowstab.m_backend.data._M_elems[0x17] = 0;
    lowstab.m_backend.data._M_elems[0x18] = 0;
    lowstab.m_backend.data._M_elems[0x19] = 0;
    lowstab.m_backend.data._M_elems._104_5_ = 0;
    lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    lowstab.m_backend.exp = 0;
    lowstab.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.5);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)this_00,&lowstab.m_backend);
    pcVar37 = &local_968;
    pnVar36 = val;
    for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
      (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
      pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
    }
    (val->m_backend).exp = local_968.exp;
    (val->m_backend).neg = local_968.neg;
    (val->m_backend).fpclass = local_968.fpclass;
    (val->m_backend).prec_elem = local_968.prec_elem;
    polish = false;
LAB_005d13ef:
    DVar23 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::selectEnter(&this->
                                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,val,leaveIdx,polish);
    uVar26._0_4_ = DVar23.info;
    uVar26._4_4_ = DVar23.idx;
    return (SPxId)uVar26;
  }
  lVar29 = (long)(int)local_e0c;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar40 = pBVar7 + lVar29;
  pnVar36 = &result_1;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar36->m_backend).data._M_elems[0] = *(uint *)&(pBVar40->val).m_backend;
    pBVar40 = (pointer)((long)pBVar40 + ((ulong)bVar53 * -2 + 1) * 4);
    pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
  }
  result_1.m_backend.exp = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x70);
  result_1.m_backend.neg = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x74);
  result_1.m_backend._120_8_ = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x78);
  local_df0 = 0xffffffff;
  do {
    lVar30 = lVar29 + 1;
    if (nBp <= lVar30) break;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&result_2.m_backend,0,(type *)0x0);
    pSVar16 = local_df8;
    if (iVar20 <= lVar29) {
      iVar20 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                         ((local_df8->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,&compare,iVar20 + 1,nBp,4,0,0,
                          true);
    }
    pBVar7 = (pSVar16->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar21 = pBVar7[lVar30].idx;
    pSVar5 = (pSVar16->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    if (pBVar7[lVar30].src == PVEC) {
      if (pSVar5->theRep *
          ((pSVar5->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[iVar21] < 1) {
        pnVar36 = local_d38 + iVar21;
        pnVar34 = &x_1;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pnVar34->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
        }
        iVar22 = local_d38[iVar21].m_backend.exp;
        x_1.m_backend.exp = iVar22;
        bVar52 = local_d38[iVar21].m_backend.neg;
        x_1.m_backend.neg = bVar52;
        fVar3 = local_d38[iVar21].m_backend.fpclass;
        iVar4 = local_d38[iVar21].m_backend.prec_elem;
        x_1.m_backend.prec_elem = iVar4;
        x_1.m_backend.fpclass = fVar3;
        pnVar36 = &x_1;
        pcVar37 = &lowstab.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
        }
        lowstab.m_backend.prec_elem = iVar4;
        lowstab.m_backend.fpclass = fVar3;
        lowstab.m_backend.neg = bVar52;
        if ((bVar52 == true) &&
           (lowstab.m_backend.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          lowstab.m_backend.neg = false;
        }
        uVar17 = result_2.m_backend._120_8_;
        if (((fVar3 != cpp_dec_float_NaN) && ((fpclass_type)local_af0 != cpp_dec_float_NaN)) &&
           (lowstab.m_backend.exp = iVar22,
           iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b68),
           uVar17 = result_2.m_backend._120_8_, 0 < iVar22)) {
          pSVar5 = (local_df8->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pSVar11 = pSVar5->thevectors;
          pIVar12 = (pSVar11->set).theitem;
          iVar22 = (pSVar11->set).thekey[iVar21].idx;
          pUVar43 = pSVar5->theCoPvec;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          iVar31 = pIVar12[iVar22].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          if (0 < iVar31) {
            pNVar51 = pIVar12[iVar22].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar31 = iVar31 + 1;
            do {
              pNVar35 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((pUVar43->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pNVar51->idx);
              result_3.m_backend.fpclass = cpp_dec_float_finite;
              result_3.m_backend.prec_elem = 0x1c;
              result_3.m_backend.data._M_elems[0] = 0;
              result_3.m_backend.data._M_elems[1] = 0;
              result_3.m_backend.data._M_elems[2] = 0;
              result_3.m_backend.data._M_elems[3] = 0;
              result_3.m_backend.data._M_elems[4] = 0;
              result_3.m_backend.data._M_elems[5] = 0;
              result_3.m_backend.data._M_elems[6] = 0;
              result_3.m_backend.data._M_elems[7] = 0;
              result_3.m_backend.data._M_elems[8] = 0;
              result_3.m_backend.data._M_elems[9] = 0;
              result_3.m_backend.data._M_elems[10] = 0;
              result_3.m_backend.data._M_elems[0xb] = 0;
              result_3.m_backend.data._M_elems[0xc] = 0;
              result_3.m_backend.data._M_elems[0xd] = 0;
              result_3.m_backend.data._M_elems[0xe] = 0;
              result_3.m_backend.data._M_elems[0xf] = 0;
              result_3.m_backend.data._M_elems[0x10] = 0;
              result_3.m_backend.data._M_elems[0x11] = 0;
              result_3.m_backend.data._M_elems[0x12] = 0;
              result_3.m_backend.data._M_elems[0x13] = 0;
              result_3.m_backend.data._M_elems[0x14] = 0;
              result_3.m_backend.data._M_elems[0x15] = 0;
              result_3.m_backend.data._M_elems[0x16] = 0;
              result_3.m_backend.data._M_elems[0x17] = 0;
              result_3.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
              result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_3.m_backend.exp = 0;
              result_3.m_backend.neg = false;
              v = pNVar51;
              if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&result_3 != pNVar35) &&
                 (v = pNVar35,
                 pNVar51 !=
                 (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&result_3)) {
                pNVar35 = pNVar51;
                pNVar44 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)&result_3;
                for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
                  (pNVar44->val).m_backend.data._M_elems[0] =
                       (pNVar35->val).m_backend.data._M_elems[0];
                  pNVar35 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar35 + (ulong)bVar53 * -8 + 4);
                  pNVar44 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar44 + (ulong)bVar53 * -8 + 4);
                }
                result_3.m_backend.exp = (pNVar51->val).m_backend.exp;
                result_3.m_backend.neg = (pNVar51->val).m_backend.neg;
                result_3.m_backend.fpclass = (pNVar51->val).m_backend.fpclass;
                result_3.m_backend.prec_elem = (pNVar51->val).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)&result_3,
                         (cpp_dec_float<200U,_int,_void> *)v);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&lowstab.m_backend,&result_3.m_backend);
              pNVar51 = pNVar51 + 1;
              iVar31 = iVar31 + -1;
            } while (1 < iVar31);
          }
          pnVar36 = &lowstab;
          pnVar34 = &result_3;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pnVar34->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
          }
          pnVar50 = (((local_df8->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar36 = &result_3;
          pnVar45 = pnVar50 + iVar21;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            *(uint *)&pnVar45->m_backend = (pnVar36->m_backend).data._M_elems[0];
            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
            pnVar45 = (pointer)((long)pnVar45 + ((ulong)bVar53 * -2 + 1) * 4);
          }
          *(int *)((long)(pnVar50 + iVar21) + 0x70) = lowstab.m_backend.exp;
          *(bool *)((long)(pnVar50 + iVar21) + 0x74) = lowstab.m_backend.neg;
          *(undefined8 *)((long)(pnVar50 + iVar21) + 0x78) = lowstab.m_backend._120_8_;
          pnVar50 = local_d48;
          if (x_1.m_backend.fpclass != cpp_dec_float_NaN) {
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x1c;
            lowstab.m_backend.data._M_elems[0] = 0;
            lowstab.m_backend.data._M_elems[1] = 0;
            lowstab.m_backend.data._M_elems[2] = 0;
            lowstab.m_backend.data._M_elems[3] = 0;
            lowstab.m_backend.data._M_elems[4] = 0;
            lowstab.m_backend.data._M_elems[5] = 0;
            lowstab.m_backend.data._M_elems[6] = 0;
            lowstab.m_backend.data._M_elems[7] = 0;
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.data._M_elems[0x10] = 0;
            lowstab.m_backend.data._M_elems[0x11] = 0;
            lowstab.m_backend.data._M_elems[0x12] = 0;
            lowstab.m_backend.data._M_elems[0x13] = 0;
            lowstab.m_backend.data._M_elems[0x14] = 0;
            lowstab.m_backend.data._M_elems[0x15] = 0;
            lowstab.m_backend.data._M_elems[0x16] = 0;
            lowstab.m_backend.data._M_elems[0x17] = 0;
            lowstab.m_backend.data._M_elems[0x18] = 0;
            lowstab.m_backend.data._M_elems[0x19] = 0;
            lowstab.m_backend.data._M_elems._104_5_ = 0;
            lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.0);
            iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&x_1.m_backend,&lowstab.m_backend);
            pnVar50 = local_d48;
            if (0 < iVar22) {
              pnVar50 = local_d28;
            }
          }
          pnVar36 = pnVar50 + iVar21;
          pcVar37 = &result_2.m_backend;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
            pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
          }
          iVar22 = pnVar50[iVar21].m_backend.exp;
          result_2.m_backend.exp = iVar22;
          bVar52 = pnVar50[iVar21].m_backend.neg;
          result_2.m_backend.neg = bVar52;
          fVar3 = pnVar50[iVar21].m_backend.fpclass;
          iVar4 = pnVar50[iVar21].m_backend.prec_elem;
          result_2.m_backend.prec_elem = iVar4;
          result_2.m_backend.fpclass = fVar3;
          result_3.m_backend.fpclass = cpp_dec_float_finite;
          result_3.m_backend.prec_elem = 0x1c;
          result_3.m_backend.data._M_elems[0] = 0;
          result_3.m_backend.data._M_elems[1] = 0;
          result_3.m_backend.data._M_elems[2] = 0;
          result_3.m_backend.data._M_elems[3] = 0;
          result_3.m_backend.data._M_elems[4] = 0;
          result_3.m_backend.data._M_elems[5] = 0;
          result_3.m_backend.data._M_elems[6] = 0;
          result_3.m_backend.data._M_elems[7] = 0;
          result_3.m_backend.data._M_elems[8] = 0;
          result_3.m_backend.data._M_elems[9] = 0;
          result_3.m_backend.data._M_elems[10] = 0;
          result_3.m_backend.data._M_elems[0xb] = 0;
          result_3.m_backend.data._M_elems[0xc] = 0;
          result_3.m_backend.data._M_elems[0xd] = 0;
          result_3.m_backend.data._M_elems[0xe] = 0;
          result_3.m_backend.data._M_elems[0xf] = 0;
          result_3.m_backend.data._M_elems[0x10] = 0;
          result_3.m_backend.data._M_elems[0x11] = 0;
          result_3.m_backend.data._M_elems[0x12] = 0;
          result_3.m_backend.data._M_elems[0x13] = 0;
          result_3.m_backend.data._M_elems[0x14] = 0;
          result_3.m_backend.data._M_elems[0x15] = 0;
          result_3.m_backend.data._M_elems[0x16] = 0;
          result_3.m_backend.data._M_elems[0x17] = 0;
          result_3.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
          result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_3.m_backend.exp = 0;
          result_3.m_backend.neg = false;
          if (&result_3.m_backend == &local_d20[iVar21].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_3.m_backend,&result_2.m_backend);
            if (result_3.m_backend.data._M_elems[0] != 0 ||
                result_3.m_backend.fpclass != cpp_dec_float_finite) {
              result_3.m_backend.neg = (bool)(result_3.m_backend.neg ^ 1);
            }
          }
          else {
            pcVar37 = &result_2.m_backend;
            pcVar33 = &result_3.m_backend;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
            }
            result_3.m_backend.prec_elem = iVar4;
            result_3.m_backend.fpclass = fVar3;
            result_3.m_backend.exp = iVar22;
            result_3.m_backend.neg = bVar52;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&result_3.m_backend,&local_d20[iVar21].m_backend);
          }
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&lowstab.m_backend,&result_3.m_backend,&x_1.m_backend);
          pcVar37 = &lowstab.m_backend;
          pcVar33 = &result_2.m_backend;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
          }
          result_2.m_backend.exp = lowstab.m_backend.exp;
          result_2.m_backend.neg = lowstab.m_backend.neg;
          result_2.m_backend.fpclass = lowstab.m_backend.fpclass;
          result_2.m_backend.prec_elem = lowstab.m_backend.prec_elem;
          uVar17 = result_2.m_backend._120_8_;
          if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
              (result_1.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_2.m_backend,&result_1.m_backend),
             uVar17 = result_2.m_backend._120_8_, iVar21 < 1)) {
            uVar18 = x_1.m_backend.neg;
            if (x_1.m_backend.neg == true) {
              uVar18 = x_1.m_backend.fpclass == cpp_dec_float_finite &&
                       x_1.m_backend.data._M_elems[0] == 0;
            }
            local_b68._0_4_ = x_1.m_backend.data._M_elems[0];
            lVar29 = 0x1b;
            puVar39 = (uint *)(local_b68 + 4);
            puVar38 = x_1.m_backend.data._M_elems + 1;
            iVar21 = x_1.m_backend.exp;
            uVar27 = x_1.m_backend._120_8_;
            goto LAB_005d28b3;
          }
        }
        goto LAB_005d2562;
      }
      pBVar7[lVar30].idx = -1;
      pUVar43 = pSVar5->thePvec;
LAB_005d1e9f:
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar43->thedelta,iVar21);
LAB_005d1eb1:
      bVar52 = false;
    }
    else {
      if (0 < pSVar5->theRep *
              ((pSVar5->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.costat)->data[iVar21]) {
        pBVar7[lVar30].idx = -1;
        pUVar43 = pSVar5->theCoPvec;
        goto LAB_005d1e9f;
      }
      pnVar36 = local_d30 + iVar21;
      pnVar34 = &result_3;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar34->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
        pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      iVar22 = local_d30[iVar21].m_backend.exp;
      result_3.m_backend.exp = iVar22;
      bVar52 = local_d30[iVar21].m_backend.neg;
      result_3.m_backend.neg = bVar52;
      fVar3 = local_d30[iVar21].m_backend.fpclass;
      iVar4 = local_d30[iVar21].m_backend.prec_elem;
      result_3.m_backend.prec_elem = iVar4;
      result_3.m_backend.fpclass = fVar3;
      pnVar36 = &result_3;
      pcVar37 = &lowstab.m_backend;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
        pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
      }
      lowstab.m_backend.prec_elem = iVar4;
      lowstab.m_backend.fpclass = fVar3;
      lowstab.m_backend.neg = bVar52;
      if ((bVar52 == true) &&
         (lowstab.m_backend.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
        lowstab.m_backend.neg = false;
      }
      uVar17 = result_2.m_backend._120_8_;
      if (((fVar3 != cpp_dec_float_NaN) &&
          (bVar52 = (fpclass_type)local_af0 != cpp_dec_float_NaN, bVar52)) &&
         (lowstab.m_backend.exp = iVar22,
         iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&lowstab.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b68),
         uVar17 = result_2.m_backend._120_8_, 0 < iVar22)) {
        pnVar50 = local_d40;
        if (result_3.m_backend.fpclass != cpp_dec_float_NaN) {
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&lowstab.m_backend,0.0);
          iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&result_3.m_backend,&lowstab.m_backend);
          pnVar50 = local_d40;
          if (0 < iVar22) {
            pnVar50 = local_d18;
          }
        }
        pnVar36 = pnVar50 + iVar21;
        pcVar37 = &result_2.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
          pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
        }
        result_2.m_backend.exp = pnVar50[iVar21].m_backend.exp;
        result_2.m_backend.neg = pnVar50[iVar21].m_backend.neg;
        result_2.m_backend.fpclass = pnVar50[iVar21].m_backend.fpclass;
        result_2.m_backend.prec_elem = pnVar50[iVar21].m_backend.prec_elem;
        x_1.m_backend.fpclass = cpp_dec_float_finite;
        x_1.m_backend.prec_elem = 0x1c;
        x_1.m_backend.data._M_elems[0] = 0;
        x_1.m_backend.data._M_elems[1] = 0;
        x_1.m_backend.data._M_elems[2] = 0;
        x_1.m_backend.data._M_elems[3] = 0;
        x_1.m_backend.data._M_elems[4] = 0;
        x_1.m_backend.data._M_elems[5] = 0;
        x_1.m_backend.data._M_elems[6] = 0;
        x_1.m_backend.data._M_elems[7] = 0;
        x_1.m_backend.data._M_elems[8] = 0;
        x_1.m_backend.data._M_elems[9] = 0;
        x_1.m_backend.data._M_elems[10] = 0;
        x_1.m_backend.data._M_elems[0xb] = 0;
        x_1.m_backend.data._M_elems[0xc] = 0;
        x_1.m_backend.data._M_elems[0xd] = 0;
        x_1.m_backend.data._M_elems[0xe] = 0;
        x_1.m_backend.data._M_elems[0xf] = 0;
        x_1.m_backend.data._M_elems[0x10] = 0;
        x_1.m_backend.data._M_elems[0x11] = 0;
        x_1.m_backend.data._M_elems[0x12] = 0;
        x_1.m_backend.data._M_elems[0x13] = 0;
        x_1.m_backend.data._M_elems[0x14] = 0;
        x_1.m_backend.data._M_elems[0x15] = 0;
        x_1.m_backend.data._M_elems[0x16] = 0;
        x_1.m_backend.data._M_elems[0x17] = 0;
        x_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        x_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        x_1.m_backend.exp = 0;
        x_1.m_backend.neg = false;
        if (&x_1.m_backend == &local_d10[iVar21].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&x_1.m_backend,&result_2.m_backend);
          if (x_1.m_backend.data._M_elems[0] != 0 || x_1.m_backend.fpclass != cpp_dec_float_finite)
          {
            x_1.m_backend.neg = (bool)(x_1.m_backend.neg ^ 1);
          }
        }
        else {
          pcVar37 = &result_2.m_backend;
          pcVar33 = &x_1.m_backend;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
          }
          x_1.m_backend.prec_elem = result_2.m_backend.prec_elem;
          x_1.m_backend.fpclass = result_2.m_backend.fpclass;
          x_1.m_backend.exp = result_2.m_backend.exp;
          x_1.m_backend.neg = result_2.m_backend.neg;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&x_1.m_backend,&local_d10[iVar21].m_backend);
        }
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x1c;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems[6] = 0;
        lowstab.m_backend.data._M_elems[7] = 0;
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.data._M_elems[0x10] = 0;
        lowstab.m_backend.data._M_elems[0x11] = 0;
        lowstab.m_backend.data._M_elems[0x12] = 0;
        lowstab.m_backend.data._M_elems[0x13] = 0;
        lowstab.m_backend.data._M_elems[0x14] = 0;
        lowstab.m_backend.data._M_elems[0x15] = 0;
        lowstab.m_backend.data._M_elems[0x16] = 0;
        lowstab.m_backend.data._M_elems[0x17] = 0;
        lowstab.m_backend.data._M_elems[0x18] = 0;
        lowstab.m_backend.data._M_elems[0x19] = 0;
        lowstab.m_backend.data._M_elems._104_5_ = 0;
        lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&lowstab.m_backend,&x_1.m_backend,&result_3.m_backend);
        pcVar37 = &lowstab.m_backend;
        pcVar33 = &result_2.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
          pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
        }
        result_2.m_backend.exp = lowstab.m_backend.exp;
        result_2.m_backend.neg = lowstab.m_backend.neg;
        uVar17._0_4_ = lowstab.m_backend.fpclass;
        uVar17._4_4_ = lowstab.m_backend.prec_elem;
        result_2.m_backend.fpclass = lowstab.m_backend.fpclass;
        result_2.m_backend.prec_elem = lowstab.m_backend.prec_elem;
        if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
            (uVar17 = result_2.m_backend._120_8_, result_1.m_backend.fpclass != cpp_dec_float_NaN))
           && (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&result_2.m_backend,&result_1.m_backend),
              uVar17 = result_2.m_backend._120_8_, iVar21 < 1)) {
          uVar18 = result_3.m_backend.neg;
          if (result_3.m_backend.neg == true) {
            uVar18 = result_3.m_backend.fpclass == cpp_dec_float_finite &&
                     result_3.m_backend.data._M_elems[0] == 0;
          }
          local_b68._0_4_ = result_3.m_backend.data._M_elems[0];
          lVar29 = 0x1b;
          puVar38 = result_3.m_backend.data._M_elems + 1;
          puVar39 = (uint *)(local_b68 + 4);
          iVar21 = result_3.m_backend.exp;
          uVar27 = result_3.m_backend._120_8_;
LAB_005d28b3:
          for (; lVar29 != 0; lVar29 = lVar29 + -1) {
            *puVar39 = *puVar38;
            puVar38 = puVar38 + (ulong)bVar53 * -2 + 1;
            puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
          }
          local_df0 = (uint)lVar30;
          uVar17 = result_2.m_backend._120_8_;
          iStack_af8 = iVar21;
          bStack_af4 = (bool)uVar18;
          local_af0 = uVar27;
        }
      }
LAB_005d2562:
      result_2.m_backend._120_8_ = uVar17;
      lowstab.m_backend.fpclass = cpp_dec_float_finite;
      lowstab.m_backend.prec_elem = 0x1c;
      lowstab.m_backend.data._M_elems[0] = 0;
      lowstab.m_backend.data._M_elems[1] = 0;
      lowstab.m_backend.data._M_elems[2] = 0;
      lowstab.m_backend.data._M_elems[3] = 0;
      lowstab.m_backend.data._M_elems[4] = 0;
      lowstab.m_backend.data._M_elems[5] = 0;
      lowstab.m_backend.data._M_elems[6] = 0;
      lowstab.m_backend.data._M_elems[7] = 0;
      lowstab.m_backend.data._M_elems[8] = 0;
      lowstab.m_backend.data._M_elems[9] = 0;
      lowstab.m_backend.data._M_elems[10] = 0;
      lowstab.m_backend.data._M_elems[0xb] = 0;
      lowstab.m_backend.data._M_elems[0xc] = 0;
      lowstab.m_backend.data._M_elems[0xd] = 0;
      lowstab.m_backend.data._M_elems[0xe] = 0;
      lowstab.m_backend.data._M_elems[0xf] = 0;
      lowstab.m_backend.data._M_elems[0x10] = 0;
      lowstab.m_backend.data._M_elems[0x11] = 0;
      lowstab.m_backend.data._M_elems[0x12] = 0;
      lowstab.m_backend.data._M_elems[0x13] = 0;
      lowstab.m_backend.data._M_elems[0x14] = 0;
      lowstab.m_backend.data._M_elems[0x15] = 0;
      lowstab.m_backend.data._M_elems[0x16] = 0;
      lowstab.m_backend.data._M_elems[0x17] = 0;
      lowstab.m_backend.data._M_elems[0x18] = 0;
      lowstab.m_backend.data._M_elems[0x19] = 0;
      lowstab.m_backend.data._M_elems._104_5_ = 0;
      lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      lowstab.m_backend.exp = 0;
      lowstab.m_backend.neg = false;
      if (&lowstab.m_backend != local_e08) {
        pcVar37 = local_e08;
        pcVar33 = &lowstab.m_backend;
        for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
          (pcVar33->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
          pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar53 * -8 + 4);
        }
        lowstab.m_backend.exp =
             (local_df8->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.exp;
        lowstab.m_backend.neg =
             (local_df8->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.neg;
        lowstab.m_backend.fpclass =
             (local_df8->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.fpclass;
        lowstab.m_backend.prec_elem =
             (local_df8->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&lowstab.m_backend,&result_1.m_backend);
      bVar52 = false;
      if (result_2.m_backend.fpclass == cpp_dec_float_NaN) goto LAB_005d1eb1;
      if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
        iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&result_2.m_backend,&lowstab.m_backend);
        bVar52 = 0 < iVar21;
      }
    }
    lVar29 = lVar30;
  } while (!bVar52);
  pSVar16 = local_df8;
  pnVar36 = &(local_df8->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).fastDelta;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x1c;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems[6] = 0;
  lowstab.m_backend.data._M_elems[7] = 0;
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.data._M_elems[0x10] = 0;
  lowstab.m_backend.data._M_elems[0x11] = 0;
  lowstab.m_backend.data._M_elems[0x12] = 0;
  lowstab.m_backend.data._M_elems[0x13] = 0;
  lowstab.m_backend.data._M_elems[0x14] = 0;
  lowstab.m_backend.data._M_elems[0x15] = 0;
  lowstab.m_backend.data._M_elems[0x16] = 0;
  lowstab.m_backend.data._M_elems[0x17] = 0;
  lowstab.m_backend.data._M_elems[0x18] = 0;
  lowstab.m_backend.data._M_elems[0x19] = 0;
  lowstab.m_backend.data._M_elems._104_5_ = 0;
  lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&lowstab.m_backend,&pnVar36->m_backend,(cpp_dec_float<200U,_int,_void> *)local_b68);
  bVar52 = lowstab.m_backend.neg;
  iVar20 = lowstab.m_backend.exp;
  pcVar37 = &lowstab.m_backend;
  puVar39 = (uint *)local_8e8;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar39 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar53 * -8 + 4);
    puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
  }
  local_dec = lowstab.m_backend.fpclass;
  local_e08 = (cpp_dec_float<200U,_int,_void> *)
              CONCAT44(local_e08._4_4_,lowstab.m_backend.prec_elem);
  bVar19 = ((pSVar16->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableLeave;
  peVar13 = (pSVar16->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (pSVar16->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar2 = peVar13->s_epsilon_multiplier;
  uVar54 = -(ulong)(dVar2 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x1c;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[0x18] = 0;
  lowstab.m_backend.data._M_elems[0x19] = 0;
  lowstab.m_backend.data._M_elems._104_5_ = 0;
  lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&lowstab,
             (double)(~uVar54 & (ulong)(dVar2 * 1e-10) | uVar54 & 0x3ddb7cdfd9d7bdbb));
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (bVar19 == false) {
    puVar39 = (uint *)local_b68;
    pnVar34 = &local_b0;
    for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *puVar39;
      puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = iStack_af8;
    local_b0.m_backend.neg = bStack_af4;
    local_b0.m_backend.fpclass = (fpclass_type)local_af0;
    local_b0.m_backend.prec_elem = local_af0._4_4_;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result_3,
                   &pSVar16->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_b0);
  }
  else {
    pnVar34 = &lowstab;
    pnVar46 = &result_3;
    for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
      (pnVar46->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
      pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
    }
    result_3.m_backend.exp = lowstab.m_backend.exp;
    result_3.m_backend.neg = lowstab.m_backend.neg;
    result_3.m_backend.fpclass = lowstab.m_backend.fpclass;
    result_3.m_backend.prec_elem = lowstab.m_backend.prec_elem;
  }
  uVar28 = local_df0;
  pnVar34 = &result_3;
  puVar39 = (uint *)local_9e8;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar39 = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
    puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
  }
  iStack_978 = result_3.m_backend.exp;
  bStack_974 = result_3.m_backend.neg;
  local_970._0_4_ = result_3.m_backend.fpclass;
  local_970._4_4_ = result_3.m_backend.prec_elem;
  if ((int)local_df0 < 0) {
    bVar19 = false;
    uVar28 = local_e0c;
    if (-1 < (int)local_e0c) {
      do {
        pBVar7 = (pSVar16->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar21 = pBVar7[local_e0c].idx;
        if (-1 < iVar21) {
          if (pBVar7[local_e0c].src == PVEC) {
            pnVar34 = &local_580;
            puVar39 = (uint *)local_9e8;
            pnVar46 = pnVar34;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar46->m_backend).data._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_580.m_backend.exp = iStack_978;
            local_580.m_backend.neg = bStack_974;
            local_580.m_backend.fpclass = (fpclass_type)local_970;
            local_580.m_backend.prec_elem = local_970._4_4_;
            pnVar46 = &local_780;
            puVar39 = (uint *)local_8e8;
            pnVar47 = pnVar46;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar47->m_backend).data._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar47 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_780.m_backend.exp = iVar20;
            local_780.m_backend.neg = bVar52;
            local_780.m_backend.fpclass = local_dec;
            local_780.m_backend.prec_elem = (int32_t)local_e08;
            pnVar47 = &local_600;
            pcVar37 = &local_968;
            pnVar48 = pnVar47;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar48->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
              pnVar48 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar48 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_600.m_backend.exp = local_968.exp;
            local_600.m_backend.neg = local_968.neg;
            local_600.m_backend.fpclass = local_968.fpclass;
            local_600.m_backend.prec_elem = local_968.prec_elem;
            BVar57 = PVEC;
            pnVar50 = local_d38;
            pnVar45 = local_d20;
            pnVar55 = local_d48;
            pnVar56 = local_d28;
          }
          else {
            puVar39 = (uint *)local_9e8;
            pnVar34 = &local_680;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_680.m_backend.exp = iStack_978;
            local_680.m_backend.neg = bStack_974;
            local_680.m_backend.fpclass = (fpclass_type)local_970;
            local_680.m_backend.prec_elem = local_970._4_4_;
            puVar39 = (uint *)local_8e8;
            pnVar34 = &local_800;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *puVar39;
              puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_800.m_backend.exp = iVar20;
            local_800.m_backend.neg = bVar52;
            local_800.m_backend.fpclass = local_dec;
            local_800.m_backend.prec_elem = (int32_t)local_e08;
            pcVar37 = &local_968;
            pnVar34 = &local_700;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
            }
            local_700.m_backend.exp = local_968.exp;
            local_700.m_backend.neg = local_968.neg;
            local_700.m_backend.fpclass = local_968.fpclass;
            local_700.m_backend.prec_elem = local_968.prec_elem;
            BVar57 = COPVEC;
            pnVar34 = &local_680;
            pnVar46 = &local_800;
            pnVar50 = local_d30;
            pnVar45 = local_d10;
            pnVar55 = local_d40;
            pnVar56 = local_d18;
            pnVar47 = &local_700;
          }
          bVar19 = getData(pSVar16,val,&enterId,iVar21,pnVar34,pnVar46,pnVar50,pnVar45,pnVar55,
                           pnVar56,BVar57,pnVar47);
        }
        uVar28 = local_e0c - 1;
      } while ((bVar19 == false) && (bVar14 = 0 < (int)local_e0c, local_e0c = uVar28, bVar14));
    }
    local_e0c = uVar28 + 1;
  }
  else {
    if ((result_3.m_backend.fpclass == cpp_dec_float_NaN ||
         (fpclass_type)local_af0 == cpp_dec_float_NaN) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_b68,
                            (cpp_dec_float<200U,_int,_void> *)local_9e8), iVar21 < 1))
    goto LAB_005d3174;
    pBVar7 = (pSVar16->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar21 = pBVar7[uVar28].idx;
    if (pBVar7[uVar28].src == PVEC) {
      pnVar34 = &local_130;
      puVar39 = (uint *)local_9e8;
      pnVar46 = pnVar34;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar46->m_backend).data._M_elems[0] = *puVar39;
        puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = iStack_978;
      local_130.m_backend.neg = bStack_974;
      local_130.m_backend.fpclass = (fpclass_type)local_970;
      local_130.m_backend.prec_elem = local_970._4_4_;
      pnVar46 = &local_1b0;
      puVar39 = (uint *)local_8e8;
      pnVar47 = pnVar46;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar47->m_backend).data._M_elems[0] = *puVar39;
        puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar47 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = iVar20;
      local_1b0.m_backend.neg = bVar52;
      local_1b0.m_backend.fpclass = local_dec;
      local_1b0.m_backend.prec_elem = (int32_t)local_e08;
      pnVar47 = &local_230;
      pcVar37 = &local_968;
      pnVar48 = pnVar47;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar48->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
        pnVar48 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar48 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = local_968.exp;
      local_230.m_backend.neg = local_968.neg;
      local_230.m_backend.fpclass = local_968.fpclass;
      local_230.m_backend.prec_elem = local_968.prec_elem;
      BVar57 = PVEC;
      pnVar50 = local_d38;
      pnVar45 = local_d20;
      pnVar55 = local_d48;
      pnVar56 = local_d28;
    }
    else {
      pnVar34 = &local_2b0;
      puVar39 = (uint *)local_9e8;
      pnVar46 = pnVar34;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar46->m_backend).data._M_elems[0] = *puVar39;
        puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar46 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = iStack_978;
      local_2b0.m_backend.neg = bStack_974;
      local_2b0.m_backend.fpclass = (fpclass_type)local_970;
      local_2b0.m_backend.prec_elem = local_970._4_4_;
      pnVar46 = &local_330;
      puVar39 = (uint *)local_8e8;
      pnVar47 = pnVar46;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar47->m_backend).data._M_elems[0] = *puVar39;
        puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
        pnVar47 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar47 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = iVar20;
      local_330.m_backend.neg = bVar52;
      local_330.m_backend.fpclass = local_dec;
      local_330.m_backend.prec_elem = (int32_t)local_e08;
      pnVar47 = &local_3b0;
      pcVar37 = &local_968;
      pnVar48 = pnVar47;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar48->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
        pnVar48 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar48 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = local_968.exp;
      local_3b0.m_backend.neg = local_968.neg;
      local_3b0.m_backend.fpclass = local_968.fpclass;
      local_3b0.m_backend.prec_elem = local_968.prec_elem;
      BVar57 = COPVEC;
      pnVar50 = local_d30;
      pnVar45 = local_d10;
      pnVar55 = local_d40;
      pnVar56 = local_d18;
    }
    bVar19 = getData(pSVar16,val,&enterId,iVar21,pnVar34,pnVar46,pnVar50,pnVar45,pnVar55,pnVar56,
                     BVar57,pnVar47);
  }
  if (bVar19 == false) {
LAB_005d3174:
    if (pSVar16->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&pSVar16->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      pSVar16->relax_count = pSVar16->relax_count + 1;
      pcVar37 = &local_968;
      pnVar36 = val;
      for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar53 * -2 + 1) * 4);
        pnVar36 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar36 + ((ulong)bVar53 * -2 + 1) * 4);
      }
      (val->m_backend).exp = local_968.exp;
      (val->m_backend).neg = local_968.neg;
      (val->m_backend).fpclass = local_968.fpclass;
      (val->m_backend).prec_elem = local_968.prec_elem;
      enterId = selectEnter(pSVar16,val,leaveIdx,false);
    }
    return (SPxId)enterId.super_DataKey;
  }
  pSVar16->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&pSVar16->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  lVar29 = (long)(int)local_e0c;
  if (0 < lVar29) {
    pBVar7 = (pSVar16->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar40 = pBVar7 + lVar29;
    puVar39 = local_500;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar39 = *(uint *)&(pBVar40->val).m_backend;
      pBVar40 = (pointer)((long)pBVar40 + ((ulong)bVar53 * -2 + 1) * 4);
      puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
    }
    iVar20 = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x70);
    bVar52 = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x74);
    uVar27 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x78);
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    puVar39 = local_500;
    pnVar34 = &result_3;
    for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *puVar39;
      puVar39 = puVar39 + (ulong)bVar53 * -2 + 1;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar53 * -2 + 1) * 4);
    }
    result_3.m_backend.neg = bVar52;
    if ((bVar52 == true) &&
       (result_3.m_backend.data._M_elems[0] != 0 || (fpclass_type)uVar27 != cpp_dec_float_finite)) {
      result_3.m_backend.neg = false;
    }
    result_3.m_backend.exp = iVar20;
    result_3.m_backend._120_8_ = uVar27;
    if (((fpclass_type)uVar27 != cpp_dec_float_NaN) &&
       ((pSVar16->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result_3.m_backend,&pnVar36->m_backend);
      if (0 < iVar20) {
        flipAndUpdate(pSVar16,(int *)&local_e0c);
        ((pSVar16->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = local_e0c;
        if (9 < (int)local_e0c) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)this_00,1);
          uVar25._0_4_ = enterId.super_DataKey.info;
          uVar25._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar25;
        }
        uVar27 = 0x3fa999999999999a;
        goto LAB_005d31f3;
      }
    }
  }
  ((pSVar16->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  uVar27 = 0x3fb999999999999a;
LAB_005d31f3:
  result_3.m_backend.data._M_elems[0] = (int)uVar27;
  result_3.m_backend.data._M_elems[1] = (int)((ulong)uVar27 >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)this_00,(double *)&result_3);
  uVar24._0_4_ = enterId.super_DataKey.info;
  uVar24._4_4_ = enterId.super_DataKey.idx;
  return (SPxId)uVar24;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}